

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdppm.c
# Opt level: O0

JDIMENSION get_text_gray_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  uint uVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  uint maxval;
  JDIMENSION col;
  JSAMPLE *rescale;
  JSAMPROW ptr;
  FILE *infile;
  ppm_source_ptr source;
  undefined4 uVar3;
  j_compress_ptr cinfo_00;
  j_compress_ptr pjVar4;
  undefined1 *local_28;
  
  uVar3 = *(undefined4 *)(in_RSI + 0x50);
  cinfo_00 = *(j_compress_ptr *)(in_RSI + 0x48);
  local_28 = (undefined1 *)**(undefined8 **)(in_RSI + 0x20);
  for (iVar2 = *(int *)(in_RDI + 0x30); iVar2 != 0; iVar2 = iVar2 + -1) {
    pjVar4 = cinfo_00;
    uVar1 = read_pbm_integer(cinfo_00,(FILE *)CONCAT44(iVar2,uVar3),(uint)((ulong)cinfo_00 >> 0x20))
    ;
    *local_28 = *(undefined1 *)((long)cinfo_00->quant_tbl_ptrs + ((ulong)uVar1 - 0x60));
    cinfo_00 = pjVar4;
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_text_gray_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading text-format PGM files with any maxval */
{
  ppm_source_ptr source = (ppm_source_ptr)sinfo;
  FILE *infile = source->pub.input_file;
  register JSAMPROW ptr;
  register JSAMPLE *rescale = source->rescale;
  JDIMENSION col;
  unsigned int maxval = source->maxval;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    *ptr++ = rescale[read_pbm_integer(cinfo, infile, maxval)];
  }
  return 1;
}